

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O0

string * trim(string *__return_storage_ptr__,string *input,string *edible)

{
  allocator<char> local_31;
  long local_30;
  size_type end;
  size_type start;
  string *edible_local;
  string *input_local;
  
  start = (size_type)edible;
  edible_local = input;
  input_local = __return_storage_ptr__;
  end = std::__cxx11::string::find_first_not_of((string *)input,(ulong)edible);
  local_30 = std::__cxx11::string::find_last_not_of((string *)edible_local,start);
  if (end == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else if (local_30 == -1) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)edible_local);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)edible_local);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string trim (const std::string& input, const std::string& edible)
{
  auto start = input.find_first_not_of (edible);
  auto end   = input.find_last_not_of  (edible);

  if (start == std::string::npos)
    return "";

  if (end == std::string::npos)
    return input.substr (start);

  return input.substr (start, end - start + 1);
}